

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O3

int use_new(void)

{
  undefined4 *puVar1;
  long *plVar2;
  ostream *poVar3;
  double *pdVar4;
  undefined8 *puVar5;
  int nights;
  
  puVar1 = (undefined4 *)operator_new(4);
  *puVar1 = 0x3e9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"nights = ",9);
  plVar2 = (long *)std::ostream::operator<<(&std::cout,0x3e9);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,0x3e9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"location = ",0xb);
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"int value = ",0xc);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,0x3e9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"; location = ",0xd);
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pdVar4 = (double *)operator_new(8);
  *pdVar4 = 10011002.0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"double value = ",0xf);
  poVar3 = std::ostream::_M_insert<double>(10011002.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"; location = ",0xd);
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size of pt = ",0xd);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size of *pt = ",0xe);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size of pd = ",0xd);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size of *pd = ",0xe);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  operator_delete(pdVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"after delete, *pd = ",0x14);
  poVar3 = std::ostream::_M_insert<double>(*pdVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  puVar5 = (undefined8 *)operator_new__(0x18);
  *puVar5 = 0x3fb999999999999a;
  puVar5[1] = 0x3fc999999999999a;
  puVar5[2] = 0x3fd3333333333333;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p3[1] is ",9);
  poVar3 = std::ostream::_M_insert<double>(0.2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"now p3[1] is ",0xd);
  poVar3 = std::ostream::_M_insert<double>(0.3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  operator_delete__(puVar5);
}

Assistant:

int use_new () {
    using namespace std;
    int nights= 1001;
    //  申请一个 int 类型的地址
    int * pt = new int;
    //  给这个地址处赋值1001
    *pt = 1001;

    cout << "nights = " << nights << endl;
    cout << nights << "location = " << & nights << endl;

    cout << "int value = " << *pt << "; location = " << pt << endl;

    double * pd = new double;
    *pd = 10011002.0;
    cout << "double value = " << *pd << "; location = " << pd << endl;

    cout << "size of pt = " << sizeof(pt) << endl;
    cout << "size of *pt = " << sizeof(*pt) << endl;

    cout << "size of pd = " << sizeof(pd) << endl;
    cout << "size of *pd = " << sizeof(*pd) << endl;

    // sizeof a address: 4 byte = 32bit

    delete pd;
    cout << "after delete, *pd = " << *pd << endl;

    // array with new

    double *p3 = new double[3];
    //  用起来和普通ARRAY没什么区别...
    p3[0] = 0.1;
    p3[1] = 0.2;
    p3[2] = 0.3;

    cout << "p3[1] is " << p3[1] << endl;
    p3 = p3 + 1;
    cout << "now p3[1] is " << p3[1] << endl;

    p3 = p3 - 1;
    delete [] p3;
    cout << "after delete, p3[1]" << p3[0] << endl;

    return 0;
}